

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

uint8_t * anon_unknown.dwarf_8110::findAttrName(uint8_t *base,uint64_t *len)

{
  long *in_RSI;
  byte *in_RDI;
  size_t i;
  uint8_t b;
  Slice SStack_38;
  uint8_t *local_30;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffd8;
  long lVar1;
  undefined7 in_stack_ffffffffffffffe0;
  byte bVar2;
  byte *local_8;
  
  bVar2 = *in_RDI;
  if ((bVar2 < 0x40) || (0xbe < bVar2)) {
    if (bVar2 == 0xbf) {
      *in_RSI = 0;
      for (lVar1 = 8; lVar1 != 0; lVar1 = lVar1 + -1) {
        *in_RSI = *in_RSI * 0x100 + (ulong)in_RDI[lVar1];
      }
      local_8 = in_RDI + 9;
    }
    else {
      arangodb::velocypack::Slice::Slice(&SStack_38,in_RDI);
      local_30 = (uint8_t *)
                 arangodb::velocypack::
                 SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::makeKey
                           (in_stack_ffffffffffffffd8);
      arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
      start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x1082eb);
      local_8 = findAttrName((uint8_t *)in_RSI,(uint64_t *)CONCAT17(bVar2,in_stack_ffffffffffffffe0)
                            );
    }
  }
  else {
    *in_RSI = (long)(int)(bVar2 - 0x40);
    local_8 = in_RDI + 1;
  }
  return local_8;
}

Assistant:

uint8_t const* findAttrName(uint8_t const* base, uint64_t& len) {
  uint8_t const b = *base;
  if (b >= 0x40 && b <= 0xbe) {
    // short UTF-8 string
    len = b - 0x40;
    return base + 1;
  }
  if (b == 0xbf) {
    // long UTF-8 string
    len = 0;
    // read string length
    for (std::size_t i = 8; i >= 1; i--) {
      len = (len << 8) + base[i];
    }
    return base + 1 + 8;  // string starts here
  }

  // translate attribute name
  return findAttrName(arangodb::velocypack::Slice(base).makeKey().start(), len);
}